

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStructTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::ShaderStructCase::ShaderStructCase
          (ShaderStructCase *this,Context *context,char *name,char *description,bool isVertexCase,
          bool usesTextures,ShaderEvalFunc evalFunc,SetupUniformsFunc setupUniformsFunc,
          char *vertShaderSource,char *fragShaderSource)

{
  char *pcVar1;
  
  deqp::gls::ShaderRenderCase::ShaderRenderCase
            (&this->super_ShaderRenderCase,context->m_testCtx,context->m_renderCtx,
             context->m_contextInfo,name,description,isVertexCase,evalFunc);
  (this->super_ShaderRenderCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderStructCase_00d21730;
  this->m_setupUniforms = setupUniformsFunc;
  this->m_usesTexture = usesTextures;
  this->m_brickTexture = (Texture2D *)0x0;
  pcVar1 = (char *)(this->super_ShaderRenderCase).m_vertShaderSource._M_string_length;
  strlen(vertShaderSource);
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_ShaderRenderCase).m_vertShaderSource,0,pcVar1,
             (ulong)vertShaderSource);
  pcVar1 = (char *)(this->super_ShaderRenderCase).m_fragShaderSource._M_string_length;
  strlen(fragShaderSource);
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_ShaderRenderCase).m_fragShaderSource,0,pcVar1,
             (ulong)fragShaderSource);
  return;
}

Assistant:

ShaderStructCase::ShaderStructCase (Context& context, const char* name, const char* description, bool isVertexCase, bool usesTextures, ShaderEvalFunc evalFunc, SetupUniformsFunc setupUniformsFunc, const char* vertShaderSource, const char* fragShaderSource)
	: ShaderRenderCase	(context.getTestContext(), context.getRenderContext(), context.getContextInfo(), name, description, isVertexCase, evalFunc)
	, m_setupUniforms	(setupUniformsFunc)
	, m_usesTexture		(usesTextures)
	, m_brickTexture	(DE_NULL)
{
	m_vertShaderSource	= vertShaderSource;
	m_fragShaderSource	= fragShaderSource;
}